

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O3

void print_values(longlong byte_offset,size_t bit_offset,size_t bits_available)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"byte offset = ",0xe);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"bit offset = ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"bits available = ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

static void
print_values(long long byte_offset, size_t bit_offset, size_t bits_available)
{
    std::cout << "byte offset = " << byte_offset << ", " << "bit offset = " << bit_offset << ", "
              << "bits available = " << bits_available << std::endl;
}